

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O3

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  char *pcVar1;
  undefined1 (*pauVar2) [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long ******pppppplVar11;
  long *****ppppplVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [16];
  pointer pcVar35;
  undefined1 *puVar36;
  int iVar37;
  aiNode **tmp;
  size_t sVar38;
  iterator iVar39;
  _List_node_base *p_Var40;
  _List_node_base *p_Var41;
  long ******pppppplVar42;
  iterator iVar43;
  _List_node_base *p_Var44;
  _List_node_base *p_Var45;
  aiNode **ppaVar46;
  long lVar47;
  aiNode *paVar48;
  ulong uVar49;
  long lVar50;
  uint uVar51;
  _Node_conflict2 *__tmp;
  ulong uVar52;
  long ******pppppplVar53;
  size_t sVar54;
  int iVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  aiMatrix4x4 inv;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  list<aiNode_*,_std::allocator<aiNode_*>_> local_108;
  aiNode *local_f0;
  _List_node_base *local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined8 uStack_b8;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  long *****local_90;
  long *****local_88;
  long local_80;
  undefined1 local_78 [8];
  float fStack_70;
  key_type local_68;
  undefined1 local_48 [16];
  _List_node_base *local_38;
  
  local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_108;
  local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_108;
  this->nodes_in = this->nodes_in + nd->mNumChildren;
  local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  local_e8 = (_List_node_base *)nodes;
  if (nd->mNumChildren != 0) {
    uVar52 = 0;
    local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&local_108;
    local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)&local_108;
    do {
      CollectNewChildren(this,nd->mChildren[uVar52],&local_108);
      nd->mChildren[uVar52] = (aiNode *)0x0;
      uVar52 = uVar52 + 1;
    } while (uVar52 < nd->mNumChildren);
  }
  pcVar1 = (nd->mName).data;
  local_d8._0_8_ = local_d8 + 0x10;
  sVar38 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,pcVar1,(nd->mName).data + sVar38);
  local_48._0_8_ = &this->locked;
  iVar39 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&(this->locked)._M_t,(key_type *)local_d8);
  local_78 = (undefined1  [8])&(this->locked)._M_t._M_impl.super__Rb_tree_header;
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((undefined1  [8])iVar39._M_node == local_78) {
    p_Var45 = (_List_node_base *)&local_108;
    if (local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_108) {
      p_Var40 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      local_f0 = nd;
      do {
        p_Var45 = p_Var40[1]._M_next;
        pcVar1 = (char *)((long)&p_Var45->_M_next + 4);
        local_d8._0_8_ = local_d8 + 0x10;
        sVar38 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,pcVar1,(long)&p_Var45->_M_next + sVar38 + 4);
        iVar43 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48._0_8_,(key_type *)local_d8);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_);
        }
        if (iVar43._M_node == iVar39._M_node) {
          p_Var45 = p_Var40[1]._M_next;
          fVar3 = (local_f0->mTransformation).a1;
          fVar4 = (local_f0->mTransformation).a2;
          fVar58 = (local_f0->mTransformation).a3;
          fVar5 = (local_f0->mTransformation).a4;
          fVar59 = *(float *)((long)&p_Var45[0x40]._M_next + 4);
          fVar60 = *(float *)&p_Var45[0x40]._M_prev;
          fVar14 = *(float *)((long)&p_Var45[0x40]._M_prev + 4);
          fVar15 = *(float *)&p_Var45[0x41]._M_next;
          fVar16 = *(float *)((long)&p_Var45[0x41]._M_next + 4);
          fVar17 = *(float *)&p_Var45[0x41]._M_prev;
          fVar18 = *(float *)((long)&p_Var45[0x41]._M_prev + 4);
          fVar19 = *(float *)&p_Var45[0x42]._M_next;
          fVar20 = *(float *)((long)&p_Var45[0x42]._M_next + 4);
          fVar21 = *(float *)&p_Var45[0x42]._M_prev;
          fVar22 = *(float *)((long)&p_Var45[0x42]._M_prev + 4);
          fVar23 = *(float *)&p_Var45[0x43]._M_next;
          pauVar2 = (undefined1 (*) [16])((long)&p_Var45[0x43]._M_next + 4);
          fVar24 = *(float *)&p_Var45[0x43]._M_prev;
          fVar25 = *(float *)((long)&p_Var45[0x43]._M_prev + 4);
          auVar33 = *(undefined1 (*) [12])*pauVar2;
          fVar26 = *(float *)&p_Var45[0x44]._M_next;
          auVar34 = *pauVar2;
          fVar6 = (local_f0->mTransformation).b2;
          fVar7 = (local_f0->mTransformation).b1;
          fVar8 = (local_f0->mTransformation).b3;
          fVar57 = (local_f0->mTransformation).b4;
          fVar56 = (local_f0->mTransformation).c2;
          fVar65 = (local_f0->mTransformation).c1;
          fVar66 = (local_f0->mTransformation).c3;
          fVar67 = (local_f0->mTransformation).c4;
          fVar63 = (local_f0->mTransformation).d2;
          fVar64 = (local_f0->mTransformation).d1;
          fVar61 = (local_f0->mTransformation).d3;
          fVar62 = (local_f0->mTransformation).d4;
          *(float *)((long)&p_Var45[0x40]._M_next + 4) =
               fVar5 * *(float *)*pauVar2 + fVar58 * fVar20 + fVar3 * fVar59 + fVar4 * fVar16;
          *(float *)&p_Var45[0x40]._M_prev =
               fVar5 * fVar24 + fVar58 * fVar21 + fVar3 * fVar60 + fVar4 * fVar17;
          *(float *)((long)&p_Var45[0x40]._M_prev + 4) =
               fVar5 * fVar25 + fVar58 * fVar22 + fVar3 * fVar14 + fVar4 * fVar18;
          *(float *)&p_Var45[0x41]._M_next =
               fVar5 * fVar26 + fVar58 * fVar23 + fVar3 * fVar15 + fVar4 * fVar19;
          local_78._0_4_ = auVar33._0_4_;
          local_78._4_4_ = auVar33._4_4_;
          fStack_70 = auVar33._8_4_;
          *(float *)((long)&p_Var45[0x41]._M_next + 4) =
               fVar57 * (float)local_78._0_4_ + fVar8 * fVar20 + fVar7 * fVar59 + fVar6 * fVar16;
          *(float *)&p_Var45[0x41]._M_prev =
               fVar57 * (float)local_78._4_4_ + fVar8 * fVar21 + fVar7 * fVar60 + fVar6 * fVar17;
          *(float *)((long)&p_Var45[0x41]._M_prev + 4) =
               fVar57 * fStack_70 + fVar8 * fVar22 + fVar7 * fVar14 + fVar6 * fVar18;
          *(float *)&p_Var45[0x42]._M_next =
               fVar57 * fVar26 + fVar8 * fVar23 + fVar7 * fVar15 + fVar6 * fVar19;
          *(float *)((long)&p_Var45[0x42]._M_next + 4) =
               fVar67 * (float)local_78._0_4_ + fVar66 * fVar20 + fVar65 * fVar59 + fVar56 * fVar16;
          *(float *)&p_Var45[0x42]._M_prev =
               fVar67 * (float)local_78._4_4_ + fVar66 * fVar21 + fVar65 * fVar60 + fVar56 * fVar17;
          *(float *)((long)&p_Var45[0x42]._M_prev + 4) =
               fVar67 * fStack_70 + fVar66 * fVar22 + fVar65 * fVar14 + fVar56 * fVar18;
          *(float *)&p_Var45[0x43]._M_next =
               fVar67 * fVar26 + fVar66 * fVar23 + fVar65 * fVar15 + fVar56 * fVar19;
          *(float *)((long)&p_Var45[0x43]._M_next + 4) =
               fVar62 * (float)local_78._0_4_ + fVar61 * fVar20 + fVar64 * fVar59 + fVar63 * fVar16;
          *(float *)&p_Var45[0x43]._M_prev =
               fVar62 * (float)local_78._4_4_ + fVar61 * fVar21 + fVar64 * fVar60 + fVar63 * fVar17;
          *(float *)((long)&p_Var45[0x43]._M_prev + 4) =
               fVar62 * fStack_70 + fVar61 * fVar22 + fVar64 * fVar14 + fVar63 * fVar18;
          *(float *)&p_Var45[0x44]._M_next =
               fVar62 * fVar26 + fVar61 * fVar23 + fVar64 * fVar15 + fVar63 * fVar19;
          _local_78 = auVar34;
          p_Var44 = (_List_node_base *)operator_new(0x18);
          p_Var45 = local_e8;
          p_Var44[1]._M_next = p_Var40[1]._M_next;
          std::__detail::_List_node_base::_M_hook(p_Var44);
          p_Var45[1]._M_next = (_List_node_base *)((long)&(p_Var45[1]._M_next)->_M_next + 1);
          p_Var44 = p_Var40->_M_next;
          local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
               local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var40);
        }
        else {
          p_Var44 = p_Var40->_M_next;
        }
        p_Var45 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        p_Var40 = p_Var44;
        nd = local_f0;
      } while (p_Var44 != (_List_node_base *)&local_108);
    }
    if ((nd->mNumMeshes == 0) && (p_Var45 == (_List_node_base *)&local_108)) {
      aiNode::~aiNode(nd);
      operator_delete(nd);
      goto LAB_00161725;
    }
    p_Var40 = (_List_node_base *)operator_new(0x18);
    p_Var45 = local_e8;
    p_Var40[1]._M_next = (_List_node_base *)nd;
    std::__detail::_List_node_base::_M_hook(p_Var40);
    p_Var45[1]._M_next = (_List_node_base *)((long)&(p_Var45[1]._M_next)->_M_next + 1);
    pcVar35 = (pointer)local_d8._0_8_;
  }
  else {
    p_Var40 = (_List_node_base *)operator_new(0x18);
    p_Var45 = local_e8;
    p_Var40[1]._M_next = (_List_node_base *)nd;
    std::__detail::_List_node_base::_M_hook(p_Var40);
    p_Var45[1]._M_next = (_List_node_base *)((long)&(p_Var45[1]._M_next)->_M_next + 1);
    local_d8._0_4_ = 1.0;
    local_d8._4_4_ = 0.0;
    local_d8._8_4_ = 0.0;
    local_d8._12_4_ = 0.0;
    local_d8._16_4_ = 0.0;
    local_d8._20_4_ = 1.0;
    local_d8._24_8_ = 0;
    uStack_b8._0_4_ = 0.0;
    uStack_b8._4_4_ = 0.0;
    local_b0 = 1.0;
    fStack_ac = 0.0;
    fStack_a8 = 0.0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 1.0;
    local_90 = (long *****)&local_90;
    local_80 = 0;
    local_88 = local_90;
    pcVar35 = (pointer)0x3f800000;
    if (local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_108) {
      p_Var45 = (_List_node_base *)0x0;
      p_Var40 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      local_f0 = (aiNode *)this;
      do {
        p_Var44 = p_Var40[1]._M_next;
        if (*(int *)&p_Var44[0x45]._M_next == 0) {
          pcVar1 = (char *)((long)&p_Var44->_M_next + 4);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          sVar38 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,pcVar1,(long)&p_Var44->_M_next + sVar38 + 4);
          iVar39 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48._0_8_,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((undefined1  [8])iVar39._M_node != local_78) goto LAB_00160b81;
          uVar51 = *(uint *)&p_Var44[0x46]._M_next;
          if ((ulong)uVar51 == 0) {
            uVar52 = 0;
LAB_00160bcb:
            if ((uint)uVar52 != uVar51) goto LAB_00160b81;
          }
          else {
            uVar52 = 0;
            do {
              if (1 < *(uint *)(*(long *)((local_f0->mName).data + 0x74) +
                               (ulong)*(uint *)((long)&(p_Var44[0x46]._M_prev)->_M_next + uVar52 * 4
                                               ) * 4)) goto LAB_00160bcb;
              uVar52 = uVar52 + 1;
            } while (uVar51 != uVar52);
          }
          if (p_Var45 == (_List_node_base *)0x0) {
            uVar27 = *(undefined8 *)((long)&p_Var44[0x40]._M_next + 4);
            uVar28 = *(undefined8 *)((long)&p_Var44[0x40]._M_prev + 4);
            uVar29 = *(undefined8 *)((long)&p_Var44[0x41]._M_next + 4);
            local_d8._24_8_ = *(undefined8 *)((long)&p_Var44[0x41]._M_prev + 4);
            uStack_b8 = *(undefined8 *)((long)&p_Var44[0x42]._M_next + 4);
            uVar30 = *(undefined8 *)((long)&p_Var44[0x42]._M_prev + 4);
            uVar31 = *(undefined8 *)((long)&p_Var44[0x43]._M_next + 4);
            uVar32 = *(undefined8 *)((long)&p_Var44[0x43]._M_prev + 4);
            fStack_a8 = (float)uVar31;
            fStack_a4 = (float)((ulong)uVar31 >> 0x20);
            fStack_a0 = (float)uVar32;
            fStack_9c = (float)((ulong)uVar32 >> 0x20);
            local_b0 = (float)uVar30;
            fStack_ac = (float)((ulong)uVar30 >> 0x20);
            local_d8._16_4_ = (undefined4)uVar29;
            local_d8._20_4_ = (undefined4)((ulong)uVar29 >> 0x20);
            local_d8._0_4_ = (undefined4)uVar27;
            local_d8._4_4_ = (undefined4)((ulong)uVar27 >> 0x20);
            local_d8._8_4_ = (undefined4)uVar28;
            local_d8._12_4_ = (undefined4)((ulong)uVar28 >> 0x20);
            aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_d8);
            p_Var45 = p_Var44;
            goto LAB_00160b81;
          }
          puVar36 = (undefined1 *)((long)&p_Var44[0x40]._M_next + 4);
          fVar3 = *(float *)puVar36;
          fVar4 = *(float *)&p_Var44[0x40]._M_prev;
          local_e8 = *(_List_node_base **)puVar36;
          fStack_e0 = *(float *)((long)&p_Var44[0x40]._M_prev + 4);
          fStack_dc = *(float *)&p_Var44[0x41]._M_next;
          fVar58 = *(float *)((long)&p_Var44[0x41]._M_next + 4);
          fVar5 = *(float *)&p_Var44[0x41]._M_prev;
          fVar6 = *(float *)((long)&p_Var44[0x41]._M_prev + 4);
          fVar7 = *(float *)&p_Var44[0x42]._M_next;
          fVar8 = *(float *)((long)&p_Var44[0x42]._M_next + 4);
          fVar57 = *(float *)&p_Var44[0x42]._M_prev;
          fVar56 = *(float *)((long)&p_Var44[0x42]._M_prev + 4);
          fVar65 = *(float *)&p_Var44[0x43]._M_next;
          fVar66 = *(float *)((long)&p_Var44[0x43]._M_next + 4);
          fVar67 = *(float *)&p_Var44[0x43]._M_prev;
          fVar63 = *(float *)((long)&p_Var44[0x43]._M_prev + 4);
          fVar64 = *(float *)&p_Var44[0x44]._M_next;
          *(float *)((long)&p_Var44[0x40]._M_next + 4) =
               (float)local_d8._12_4_ * fVar66 +
               (float)local_d8._8_4_ * fVar8 +
               (float)local_d8._0_4_ * fVar3 + (float)local_d8._4_4_ * fVar58;
          *(float *)&p_Var44[0x40]._M_prev =
               (float)local_d8._12_4_ * fVar67 +
               (float)local_d8._8_4_ * fVar57 +
               (float)local_d8._0_4_ * fVar4 + (float)local_d8._4_4_ * fVar5;
          *(float *)((long)&p_Var44[0x40]._M_prev + 4) =
               (float)local_d8._12_4_ * fVar63 +
               (float)local_d8._8_4_ * fVar56 +
               (float)local_d8._0_4_ * fStack_e0 + (float)local_d8._4_4_ * fVar6;
          *(float *)&p_Var44[0x41]._M_next =
               (float)local_d8._12_4_ * fVar64 +
               (float)local_d8._8_4_ * fVar65 +
               (float)local_d8._0_4_ * fStack_dc + (float)local_d8._4_4_ * fVar7;
          *(float *)((long)&p_Var44[0x41]._M_next + 4) =
               (float)local_d8._28_4_ * fVar66 +
               (float)local_d8._24_4_ * fVar8 +
               (float)local_d8._16_4_ * fVar3 + (float)local_d8._20_4_ * fVar58;
          *(float *)&p_Var44[0x41]._M_prev =
               (float)local_d8._28_4_ * fVar67 +
               (float)local_d8._24_4_ * fVar57 +
               (float)local_d8._16_4_ * fVar4 + (float)local_d8._20_4_ * fVar5;
          *(float *)((long)&p_Var44[0x41]._M_prev + 4) =
               (float)local_d8._28_4_ * fVar63 +
               (float)local_d8._24_4_ * fVar56 +
               (float)local_d8._16_4_ * fStack_e0 + (float)local_d8._20_4_ * fVar6;
          *(float *)&p_Var44[0x42]._M_next =
               (float)local_d8._28_4_ * fVar64 +
               (float)local_d8._24_4_ * fVar65 +
               (float)local_d8._16_4_ * fStack_dc + (float)local_d8._20_4_ * fVar7;
          *(float *)((long)&p_Var44[0x42]._M_next + 4) =
               fStack_ac * fVar66 +
               local_b0 * fVar8 + (float)uStack_b8 * fVar3 + uStack_b8._4_4_ * fVar58;
          *(float *)&p_Var44[0x42]._M_prev =
               fStack_ac * fVar67 +
               local_b0 * fVar57 + (float)uStack_b8 * fVar4 + uStack_b8._4_4_ * fVar5;
          *(float *)((long)&p_Var44[0x42]._M_prev + 4) =
               fStack_ac * fVar63 +
               local_b0 * fVar56 + (float)uStack_b8 * fStack_e0 + uStack_b8._4_4_ * fVar6;
          *(float *)&p_Var44[0x43]._M_next =
               fStack_ac * fVar64 +
               local_b0 * fVar65 + (float)uStack_b8 * fStack_dc + uStack_b8._4_4_ * fVar7;
          *(float *)((long)&p_Var44[0x43]._M_next + 4) =
               fStack_9c * fVar66 + fStack_a0 * fVar8 + fStack_a8 * fVar3 + fStack_a4 * fVar58;
          *(float *)&p_Var44[0x43]._M_prev =
               fStack_9c * fVar67 + fStack_a0 * fVar57 + fStack_a8 * fVar4 + fStack_a4 * fVar5;
          *(float *)((long)&p_Var44[0x43]._M_prev + 4) =
               fStack_9c * fVar63 + fStack_a0 * fVar56 + fStack_a8 * fStack_e0 + fStack_a4 * fVar6;
          *(float *)&p_Var44[0x44]._M_next =
               fStack_9c * fVar64 + fStack_a0 * fVar65 + fStack_a8 * fStack_dc + fStack_a4 * fVar7;
          p_Var41 = (_List_node_base *)operator_new(0x18);
          p_Var41[1]._M_next = p_Var44;
          std::__detail::_List_node_base::_M_hook(p_Var41);
          local_80 = local_80 + 1;
          p_Var44 = p_Var40->_M_next;
          local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
               local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var40);
        }
        else {
LAB_00160b81:
          p_Var44 = p_Var40->_M_next;
        }
        this = (OptimizeGraphProcess *)local_f0;
        p_Var40 = p_Var44;
      } while (p_Var44 != (_List_node_base *)&local_108);
      if ((long ******)local_90 != &local_90 && p_Var45 != (_List_node_base *)0x0) {
        *(int *)((local_f0->mName).data + 0x6c) = *(int *)((local_f0->mName).data + 0x6c) + 1;
        iVar55 = 0;
        local_e8 = p_Var45;
        iVar37 = snprintf((char *)((long)&p_Var45->_M_next + 4),0x400,"$MergedNode_%i");
        pppppplVar53 = (long ******)local_90;
        p_Var45 = local_e8;
        *(int *)&local_e8->_M_next = iVar37;
        pppppplVar42 = (long ******)local_90;
        if ((long ******)local_90 != &local_90) {
          do {
            pppppplVar11 = (long ******)*pppppplVar42;
            iVar55 = iVar55 + *(int *)(pppppplVar42[2] + 0x8c);
            pppppplVar42 = pppppplVar11;
          } while (pppppplVar11 != &local_90);
          if (iVar55 != 0) {
            local_38 = (_List_node_base *)
                       operator_new__((ulong)(uint)(*(int *)&local_e8[0x46]._M_next + iVar55) << 2);
            p_Var40 = local_38;
            if (*(int *)&p_Var45[0x46]._M_next != 0) {
              lVar50 = 0;
              uVar52 = 0;
              do {
                *(undefined4 *)((long)&local_38->_M_next + uVar52 * 4) =
                     *(undefined4 *)((long)&(p_Var45[0x46]._M_prev)->_M_next + uVar52 * 4);
                uVar52 = uVar52 + 1;
                lVar50 = lVar50 + 4;
              } while (uVar52 < *(uint *)&p_Var45[0x46]._M_next);
              p_Var40 = (_List_node_base *)((long)&local_38->_M_next + lVar50);
            }
            if (pppppplVar53 != &local_90) {
              do {
                paVar48 = (aiNode *)pppppplVar53[2];
                if (paVar48->mNumMeshes != 0) {
                  uVar52 = 0;
                  do {
                    uVar51 = paVar48->mMeshes[uVar52];
                    *(uint *)&p_Var40->_M_next = uVar51;
                    paVar48 = (aiNode *)pppppplVar53[2];
                    fVar3 = (paVar48->mTransformation).a1;
                    fVar4 = (paVar48->mTransformation).a2;
                    fVar58 = (paVar48->mTransformation).a3;
                    fVar5 = (paVar48->mTransformation).b1;
                    uVar9 = (paVar48->mTransformation).b2;
                    uVar10 = (paVar48->mTransformation).b3;
                    fVar6 = (paVar48->mTransformation).c1;
                    fVar7 = (paVar48->mTransformation).c2;
                    fVar8 = (paVar48->mTransformation).c3;
                    fVar66 = fVar5 * -fVar4;
                    local_48 = ZEXT416((uint)fVar7);
                    fVar67 = -fVar58;
                    _local_78 = ZEXT416((uint)fVar6);
                    fVar65 = (float)uVar9 * fVar67 * fVar6 +
                             fVar58 * fVar5 * fVar7 +
                             fVar66 * fVar8 +
                             fVar4 * (float)uVar10 * fVar6 +
                             (fVar3 * (float)uVar9 * fVar8 - (float)uVar10 * fVar3 * fVar7);
                    fVar56 = NAN;
                    fVar58 = NAN;
                    fVar57 = NAN;
                    if ((fVar65 != 0.0) ||
                       (fVar63 = fVar58, fVar64 = fVar57, fVar61 = fVar58, fVar62 = fVar57,
                       fVar59 = fVar58, fVar60 = fVar57, NAN(fVar65))) {
                      fVar65 = 1.0 / fVar65;
                      fVar58 = -fVar65;
                      fVar56 = ((float)uVar10 * fVar4 + (float)uVar9 * fVar67) * fVar65;
                      fVar61 = ((float)uVar9 * fVar8 + fVar7 * -(float)uVar10) * fVar65;
                      fVar62 = (fVar4 * fVar8 + fVar7 * fVar67) * fVar58;
                      fVar63 = (fVar5 * fVar7 + -(float)uVar9 * fVar6) * fVar65;
                      fVar64 = (fVar3 * fVar7 + -fVar4 * fVar6) * fVar58;
                      fVar59 = (fVar3 * (float)uVar9 + fVar66) * fVar65;
                      fVar60 = (fVar3 * (float)uVar10 + fVar67 * fVar5) * fVar58;
                      fVar58 = fVar58 * (fVar8 * fVar5 + -(float)uVar10 * fVar6);
                      fVar57 = fVar65 * (fVar8 * fVar3 + fVar67 * fVar6);
                    }
                    lVar50 = *(long *)(*(long *)(*(long *)((((aiNode *)this)->mName).data + 0x14) +
                                                0x18) + (ulong)uVar51 * 8);
                    if (*(int *)(lVar50 + 4) != 0) {
                      lVar47 = 8;
                      uVar49 = 0;
                      do {
                        ppppplVar12 = pppppplVar53[2];
                        lVar13 = *(long *)(lVar50 + 0x10);
                        fVar3 = *(float *)(lVar13 + -8 + lVar47);
                        fVar4 = *(float *)(lVar13 + -4 + lVar47);
                        fVar5 = *(float *)(lVar13 + lVar47);
                        fVar6 = *(float *)(ppppplVar12 + 0x85);
                        fVar7 = *(float *)((long)ppppplVar12 + 0x424);
                        fVar8 = *(float *)((long)ppppplVar12 + 0x42c);
                        fVar65 = *(float *)(ppppplVar12 + 0x86);
                        *(ulong *)(lVar13 + -8 + lVar47) =
                             CONCAT44(*(float *)(ppppplVar12 + 0x84) +
                                      fVar5 * *(float *)((long)ppppplVar12 + 0x41c) +
                                      fVar3 * *(float *)((long)ppppplVar12 + 0x414) +
                                      *(float *)(ppppplVar12 + 0x83) * fVar4,
                                      *(float *)(ppppplVar12 + 0x82) +
                                      fVar5 * *(float *)((long)ppppplVar12 + 0x40c) +
                                      fVar3 * *(float *)((long)ppppplVar12 + 0x404) +
                                      *(float *)(ppppplVar12 + 0x81) * fVar4);
                        *(float *)(lVar13 + lVar47) =
                             fVar5 * fVar8 + fVar3 * fVar7 + fVar4 * fVar6 + fVar65;
                        lVar13 = *(long *)(lVar50 + 0x18);
                        uVar51 = *(uint *)(lVar50 + 4);
                        if (uVar51 != 0 && lVar13 != 0) {
                          fVar3 = *(float *)(lVar13 + -8 + lVar47);
                          fVar4 = *(float *)(lVar13 + -4 + lVar47);
                          fVar5 = *(float *)(lVar13 + lVar47);
                          *(ulong *)(lVar13 + -8 + lVar47) =
                               CONCAT44(fVar5 * fVar64 + fVar3 * fVar62 + fVar4 * fVar57,
                                        fVar5 * fVar63 + fVar3 * fVar61 + fVar4 * fVar58);
                          *(float *)(lVar13 + lVar47) =
                               fVar56 * fVar3 + fVar60 * fVar4 + fVar59 * fVar5;
                          uVar51 = *(uint *)(lVar50 + 4);
                        }
                        lVar13 = *(long *)(lVar50 + 0x20);
                        if ((lVar13 != 0) && (*(long *)(lVar50 + 0x28) != 0)) {
                          if (uVar51 == 0) {
                            uVar51 = 0;
                          }
                          else {
                            fVar3 = *(float *)(lVar13 + -8 + lVar47);
                            fVar4 = *(float *)(lVar13 + -4 + lVar47);
                            fVar5 = *(float *)(lVar13 + lVar47);
                            *(ulong *)(lVar13 + -8 + lVar47) =
                                 CONCAT44(fVar5 * fVar64 + fVar3 * fVar62 + fVar4 * fVar57,
                                          fVar5 * fVar63 + fVar3 * fVar61 + fVar4 * fVar58);
                            *(float *)(lVar13 + lVar47) =
                                 fVar56 * fVar3 + fVar60 * fVar4 + fVar59 * fVar5;
                            lVar13 = *(long *)(lVar50 + 0x28);
                            fVar3 = *(float *)(lVar13 + -8 + lVar47);
                            fVar4 = *(float *)(lVar13 + -4 + lVar47);
                            fVar5 = *(float *)(lVar13 + lVar47);
                            *(ulong *)(lVar13 + -8 + lVar47) =
                                 CONCAT44(fVar5 * fVar64 + fVar3 * fVar62 + fVar4 * fVar57,
                                          fVar5 * fVar63 + fVar3 * fVar61 + fVar4 * fVar58);
                            *(float *)(lVar13 + lVar47) =
                                 fVar56 * fVar3 + fVar60 * fVar4 + fVar59 * fVar5;
                            uVar51 = *(uint *)(lVar50 + 4);
                          }
                        }
                        uVar49 = uVar49 + 1;
                        lVar47 = lVar47 + 0xc;
                      } while (uVar49 < uVar51);
                      paVar48 = (aiNode *)pppppplVar53[2];
                    }
                    p_Var40 = (_List_node_base *)((long)&p_Var40->_M_next + 4);
                    uVar52 = uVar52 + 1;
                  } while (uVar52 < paVar48->mNumMeshes);
                }
                aiNode::~aiNode(paVar48);
                operator_delete(paVar48);
                pppppplVar53 = (long ******)*pppppplVar53;
                p_Var45 = local_e8;
              } while (pppppplVar53 != &local_90);
            }
            if (p_Var45[0x46]._M_prev != (_List_node_base *)0x0) {
              operator_delete__(p_Var45[0x46]._M_prev);
            }
            local_e8[0x46]._M_prev = local_38;
            *(int *)&local_e8[0x46]._M_next = *(int *)&local_e8[0x46]._M_next + iVar55;
          }
        }
      }
      pcVar35 = (pointer)CONCAT44(local_d8._4_4_,local_d8._0_4_);
      pppppplVar53 = (long ******)local_90;
      while (pppppplVar53 != &local_90) {
        pppppplVar42 = (long ******)*pppppplVar53;
        operator_delete(pppppplVar53);
        pcVar35 = (pointer)CONCAT44(local_d8._4_4_,local_d8._0_4_);
        pppppplVar53 = pppppplVar42;
      }
    }
  }
  if ((local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next == (_List_node_base *)&local_108) ||
     (nd->mNumChildren <
      local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size)) {
    local_d8._0_8_ = pcVar35;
    if (nd->mChildren != (aiNode **)0x0) {
      operator_delete__(nd->mChildren);
    }
    sVar54 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
    ;
    p_Var45 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
    if (local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_108) {
      ppaVar46 = (aiNode **)
                 operator_new__(-(ulong)(local_108.
                                         super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                         _M_impl._M_node._M_size >> 0x3d != 0) |
                                local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                _M_impl._M_node._M_size * 8);
      nd->mChildren = ppaVar46;
      pcVar35 = (pointer)local_d8._0_8_;
      goto LAB_001616d2;
    }
    nd->mChildren = (aiNode **)0x0;
    nd->mNumChildren =
         (uint)local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size;
    uVar51 = (uint)local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                   _M_size;
  }
  else {
    ppaVar46 = nd->mChildren;
    sVar54 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
    ;
    p_Var45 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
LAB_001616d2:
    nd->mNumChildren = (uint)sVar54;
    uVar51 = (uint)sVar54;
    local_d8._0_8_ = pcVar35;
    if (p_Var45 != (_List_node_base *)&local_108 && ppaVar46 != (aiNode **)0x0) {
      do {
        paVar48 = (aiNode *)p_Var45[1]._M_next;
        *ppaVar46 = paVar48;
        ppaVar46 = ppaVar46 + 1;
        paVar48->mParent = nd;
        p_Var45 = p_Var45->_M_next;
      } while (p_Var45 != (_List_node_base *)&local_108);
      uVar51 = (uint)local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node
                     ._M_size;
    }
  }
  pcVar1 = (((aiNode *)this)->mName).data + 0x68;
  *(uint *)pcVar1 = *(int *)pcVar1 + uVar51;
LAB_00161725:
  p_Var45 = local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (local_108.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_108) {
    do {
      p_Var40 = p_Var45->_M_next;
      operator_delete(p_Var45);
      p_Var45 = p_Var40;
    } while (p_Var40 != (_List_node_base *)&local_108);
  }
  return;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode* nd, std::list<aiNode*>& nodes) {
    nodes_in += nd->mNumChildren;

    // Process children
    std::list<aiNode*> child_nodes;
    for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
        CollectNewChildren(nd->mChildren[i],child_nodes);
        nd->mChildren[i] = nullptr;
    }

    // Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
    if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end() ) {
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

            if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
                (*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
                nodes.push_back(*it);

                it = child_nodes.erase(it);
                continue;
            }
            ++it;
        }

        if (nd->mNumMeshes || !child_nodes.empty()) {
            nodes.push_back(nd);
        } else {
            delete nd; /* bye, node */
            return;
        }
    } else {

        // Retain our current position in the hierarchy
        nodes.push_back(nd);

        // Now check for possible optimizations in our list of child nodes. join as many as possible
        aiNode* join_master = NULL;
        aiMatrix4x4 inv;

        const LockedSetType::const_iterator end = locked.end();

        std::list<aiNode*> join;
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end();)   {
            aiNode* child = *it;
            if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

                // There may be no instanced meshes
                unsigned int n = 0;
                for (; n < child->mNumMeshes;++n) {
                    if (meshes[child->mMeshes[n]] > 1) {
                        break;
                    }
                }
                if (n == child->mNumMeshes) {
                    if (!join_master) {
                        join_master = child;
                        inv = join_master->mTransformation;
                        inv.Inverse();
                    } else {
                        child->mTransformation = inv * child->mTransformation ;

                        join.push_back(child);
                        it = child_nodes.erase(it);
                        continue;
                    }
                }
            }
            ++it;
        }
        if (join_master && !join.empty()) {
            join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i",count_merged++);

            unsigned int out_meshes = 0;
            for (std::list<aiNode*>::iterator it = join.begin(); it != join.end(); ++it) {
                out_meshes += (*it)->mNumMeshes;
            }

            // copy all mesh references in one array
            if (out_meshes) {
                unsigned int* meshes = new unsigned int[out_meshes+join_master->mNumMeshes], *tmp = meshes;
                for (unsigned int n = 0; n < join_master->mNumMeshes;++n) {
                    *tmp++ = join_master->mMeshes[n];
                }

                for (std::list<aiNode*>::iterator it = join.begin(); it != join.end(); ++it) {
                    for (unsigned int n = 0; n < (*it)->mNumMeshes; ++n) {

                        *tmp = (*it)->mMeshes[n];
                        aiMesh* mesh = mScene->mMeshes[*tmp++];

                        // manually move the mesh into the right coordinate system
                        const aiMatrix3x3 IT = aiMatrix3x3( (*it)->mTransformation ).Inverse().Transpose();
                        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

                            mesh->mVertices[a] *= (*it)->mTransformation;

                            if (mesh->HasNormals())
                                mesh->mNormals[a] *= IT;

                            if (mesh->HasTangentsAndBitangents()) {
                                mesh->mTangents[a] *= IT;
                                mesh->mBitangents[a] *= IT;
                            }
                        }
                    }
                    delete *it; // bye, node
                }
                delete[] join_master->mMeshes;
                join_master->mMeshes = meshes;
                join_master->mNumMeshes += out_meshes;
            }
        }
    }
    // reassign children if something changed
    if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

        delete[] nd->mChildren;

        if (!child_nodes.empty()) {
            nd->mChildren = new aiNode*[child_nodes.size()];
        }
        else nd->mChildren = nullptr;
    }

    nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

    if (nd->mChildren) {
        aiNode** tmp = nd->mChildren;
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
            aiNode* node = *tmp++ = *it;
            node->mParent = nd;
        }
    }

    nodes_out += static_cast<unsigned int>(child_nodes.size());
}